

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O1

void __thiscall
dynamicgraph::Signal<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_int>::~Signal
          (Signal<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_int> *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__Signal_0012aa48;
  boost::
  function2<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_&,_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_&,_int>
  ::~function2(&this->Tfunction);
  free((this->Tcopy2).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  free((this->Tcopy1).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  (this->super_SignalBase<int>)._vptr_SignalBase = (_func_int **)&PTR__SignalBase_00129a48;
  pcVar1 = (this->super_SignalBase<int>).name._M_dataplus._M_p;
  paVar2 = &(this->super_SignalBase<int>).name.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~Signal() {}